

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_algorithm.cpp
# Opt level: O0

void string_sort(void)

{
  bool bVar1;
  istream *piVar2;
  ostream *poVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var4;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var5;
  ulong uVar6;
  bool local_72;
  int local_54;
  int local_50;
  int i;
  int l;
  int c;
  undefined1 local_28 [8];
  string letters;
  
  std::__cxx11::string::string((string *)local_28);
  std::operator<<((ostream *)&std::cout,"Enter the letter group(\'quit\' to quit): ");
  while( true ) {
    piVar2 = std::operator>>((istream *)&std::cin,(string *)local_28);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    local_72 = false;
    if (bVar1) {
      local_72 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_28,"quit");
    }
    if (local_72 == false) break;
    poVar3 = std::operator<<((ostream *)&std::cout,"Permutation of ");
    poVar3 = std::operator<<(poVar3,(string *)local_28);
    std::operator<<(poVar3,": ");
    _Var4._M_current = (char *)std::__cxx11::string::begin();
    _Var5._M_current = (char *)std::__cxx11::string::end();
    std::sort<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(_Var4,_Var5);
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)local_28);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    i = 1;
    for (local_50 = 1; uVar6 = std::__cxx11::string::size(), (ulong)(long)local_50 <= uVar6;
        local_50 = local_50 + 1) {
      i = local_50 * i;
    }
    poVar3 = std::operator<<((ostream *)&std::cout,"\nPossible sorts: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,i);
    std::operator<<(poVar3," types, as follow:\n");
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,0);
    poVar3 = std::operator<<(poVar3,"\t");
    poVar3 = std::operator<<(poVar3,(string *)local_28);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    local_54 = 1;
    while( true ) {
      _Var4._M_current = (char *)std::__cxx11::string::begin();
      _Var5._M_current = (char *)std::__cxx11::string::end();
      bVar1 = std::next_permutation<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                        (_Var4,_Var5);
      if (!bVar1) break;
      poVar3 = (ostream *)std::ostream::operator<<(&std::cout,local_54);
      poVar3 = std::operator<<(poVar3,"\t");
      poVar3 = std::operator<<(poVar3,(string *)local_28);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      local_54 = local_54 + 1;
    }
    std::operator<<((ostream *)&std::cout,"\nEnter next sequence: ");
  }
  std::operator<<((ostream *)&std::cout,"Finish...\n");
  std::__cxx11::string::~string((string *)local_28);
  return;
}

Assistant:

void string_sort() {
    using namespace std;
    string letters;
    cout << "Enter the letter group('quit' to quit): ";
    while(cin >> letters && letters != "quit") {
        cout << "Permutation of " << letters << ": ";
        //  string also implies STL interfaces, has begin(), end(), etc
        //  in-place algorithm
        sort(letters.begin(), letters.end());
        cout << letters << endl;

        int c = 1;
        int l = 1;
        while(l <= letters.size()) {
            c *= l;
            l++;
        }
        // FIXME: same letter doesn't sort differently
        cout << "\nPossible sorts: " << c << " types, as follow:\n";
        cout << 0 << "\t" << letters << endl;

        int i = 1;
        //  next_permutation: try to sort range[] in another type
        //  so this will output all kinds of order of input string
        while(next_permutation(letters.begin(), letters.end())) {
            cout << i << "\t" << letters << endl;
            i++;
        }
        cout << "\nEnter next sequence: ";
    }

    cout << "Finish...\n";
}